

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec-wrapper.h
# Opt level: O3

string * __thiscall
wasm::generateSpecWrapper_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Module *wasm)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  Type *pTVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  size_t *psVar7;
  ulong uVar8;
  char *__assertion;
  long *plVar9;
  Name NVar10;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  Type local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  Iterator __begin2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar9 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  if (plVar9 != plVar1) {
    do {
      lVar2 = *plVar9;
      if (*(int *)(lVar2 + 0x10) == 0) {
        puVar6 = (undefined8 *)(lVar2 + 0x18);
        if (*(char *)(lVar2 + 0x28) != '\0') {
          puVar6 = (undefined8 *)0x0;
        }
        NVar10.super_IString.str._M_str = (char *)*puVar6;
        NVar10.super_IString.str._M_len = (size_t)this;
        ::wasm::Module::getFunctionOrNull(NVar10);
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"(invoke \"","");
        lVar2 = ((long *)*plVar9)[1];
        local_90 = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,lVar2,*(long *)*plVar9 + lVar2);
        uVar8 = 0xf;
        if (local_b0 != local_a0) {
          uVar8 = local_a0[0];
        }
        if (uVar8 < (ulong)(local_88 + local_a8)) {
          uVar8 = 0xf;
          if (local_90 != local_80) {
            uVar8 = local_80[0];
          }
          if (uVar8 < (ulong)(local_88 + local_a8)) goto LAB_001a7fba;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
        }
        else {
LAB_001a7fba:
          puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
        }
        local_70.id = (uintptr_t)&local_60;
        plVar3 = puVar6 + 2;
        if ((long *)*puVar6 == plVar3) {
          local_60 = *plVar3;
          uStack_58 = puVar6[3];
        }
        else {
          local_60 = *plVar3;
          local_70.id = (uintptr_t)*puVar6;
        }
        local_68 = puVar6[1];
        *puVar6 = plVar3;
        puVar6[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_50 = (undefined1  [8])
                   &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index;
        psVar7 = (size_t *)(plVar3 + 2);
        if ((size_t *)*plVar3 == psVar7) {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar7;
        }
        else {
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
               *psVar7;
          local_50 = (undefined1  [8])*plVar3;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
        if (local_50 !=
            (undefined1  [8])
            &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index) {
          operator_delete((void *)local_50,
                          __begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                          + 1);
        }
        if ((long *)local_70.id != &local_60) {
          operator_delete((void *)local_70.id,local_60 + 1);
        }
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        local_70.id = ::wasm::HeapType::getSignature();
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        local_50 = (undefined1  [8])&local_70;
        pTVar4 = (Type *)Type::size(&local_70);
        if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
            pTVar4) goto LAB_001a81b7;
        do {
          do {
            puVar5 = (ulong *)::wasm::Type::Iterator::operator*((Iterator *)local_50);
            uVar8 = *puVar5;
            if ((uVar8 & 1) != 0 && 6 < uVar8) {
              __assertion = "!param.isTuple() && \"Unexpected tuple type\"";
LAB_001a8204:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                            ,0x25,"std::string wasm::generateSpecWrapper(Module &)");
            }
            switch(uVar8) {
            case 0:
            case 1:
              ::wasm::handle_unreachable
                        ("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/spec-wrapper.h"
                         ,0x38);
            case 2:
              break;
            case 3:
              break;
            case 4:
              break;
            case 5:
              break;
            case 6:
              break;
            default:
              __assertion = "param.isBasic() && \"TODO: handle compound types\"";
              goto LAB_001a8204;
            }
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent != pTVar4);
LAB_001a81b7:
        } while (local_50 != (undefined1  [8])&local_70);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != plVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateSpecWrapper(Module& wasm) {
  std::string ret;
  for (auto& exp : wasm.exports) {
    if (exp->kind != ExternalKind::Function) {
      continue; // something exported other than a function
    }
    auto* func = wasm.getFunctionOrNull(*exp->getInternalName());
    ret += std::string("(invoke \"") + exp->name.toString() + "\" ";
    for (const auto& param : func->getParams()) {
      // zeros in arguments TODO more?
      TODO_SINGLE_COMPOUND(param);
      switch (param.getBasic()) {
        case Type::i32:
          ret += "(i32.const 0)";
          break;
        case Type::i64:
          ret += "(i64.const 0)";
          break;
        case Type::f32:
          ret += "(f32.const 0)";
          break;
        case Type::f64:
          ret += "(f64.const 0)";
          break;
        case Type::v128:
          ret += "(v128.const i32x4 0 0 0 0)";
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      ret += " ";
    }
    ret += ") ";
  }
  return ret;
}